

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

Node * wasm::DataFlow::Node::makePhi(Node *block,Index index)

{
  Node *this;
  Node *ret;
  Index index_local;
  Node *block_local;
  
  this = (Node *)operator_new(0x30);
  Node(this,Phi);
  addValue(this,block);
  (this->field_1).index = index;
  return this;
}

Assistant:

static Node* makePhi(Node* block, Index index) {
    Node* ret = new Node(Phi);
    ret->addValue(block);
    ret->index = index;
    return ret;
  }